

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void constructAutomaticIndex
               (Parse *pParse,WhereClause *pWC,SrcList_item *pSrc,Bitmask notReady,
               WhereLevel *pLevel)

{
  Vdbe *p;
  Table *pTVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  long *plVar5;
  Index *pIVar6;
  CollSeq *pCVar7;
  long lVar8;
  ulong uVar9;
  long in_RDX;
  long *in_RSI;
  Parse *in_RDI;
  long in_R8;
  int regYield;
  Expr *pX;
  Bitmask cMask_1;
  int iCol_1;
  Bitmask cMask;
  int iCol;
  Expr *pExpr;
  int regBase;
  int addrCounter;
  SrcList_item *pTabItem;
  int iContinue;
  Expr *pPartial;
  u8 sentWarning;
  Bitmask extraCols;
  Bitmask idxCols;
  char *zNotUsed;
  WhereLoop *pLoop;
  CollSeq *pColl;
  int mxBitCol;
  int i;
  int n;
  int regRecord;
  int addrTop;
  Table *pTable;
  int addrInit;
  Vdbe *v;
  Index *pIdx;
  WhereTerm *pWCEnd;
  WhereTerm *pTerm;
  int nKeyCol;
  Expr *in_stack_fffffffffffffeb8;
  u32 addr;
  undefined4 in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffec4;
  int in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  char *in_stack_fffffffffffffed0;
  Parse *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  int iVar10;
  ulong in_stack_fffffffffffffee8;
  ulong uVar11;
  sqlite3 *in_stack_fffffffffffffef0;
  Index *in_stack_fffffffffffffef8;
  int in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  Expr *in_stack_ffffffffffffff08;
  Parse *in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff18;
  int local_b4;
  Index *local_b0;
  ulong local_98;
  long *plVar12;
  int local_70;
  int local_6c;
  long *local_38;
  int local_2c;
  
  bVar2 = false;
  local_b0 = (Index *)0x0;
  local_b4 = 0;
  p = in_RDI->pVdbe;
  sqlite3VdbeAddOp0((Vdbe *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                    (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
  local_2c = 0;
  pTVar1 = *(Table **)(in_RDX + 0x20);
  plVar5 = (long *)(in_RSI[4] + (long)*(int *)((long)in_RSI + 0x14) * 0x40);
  plVar12 = *(long **)(in_R8 + 0x48);
  local_98 = 0;
  for (local_38 = (long *)in_RSI[4]; local_38 < plVar5; local_38 = local_38 + 8) {
    if ((((*plVar12 == 0) && ((*(ushort *)((long)local_38 + 0x12) & 2) == 0)) &&
        ((*(uint *)(*local_38 + 4) & 1) == 0)) &&
       (iVar3 = sqlite3ExprIsTableConstant
                          ((Expr *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                           (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20)), iVar3 != 0)) {
      in_stack_fffffffffffffef0 = in_RDI->db;
      sqlite3ExprDup((sqlite3 *)in_stack_fffffffffffffed0,
                     (Expr *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                     in_stack_fffffffffffffec4);
      pIVar6 = (Index *)sqlite3ExprAnd((sqlite3 *)
                                       CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8)
                                       ,(Expr *)CONCAT44(in_stack_fffffffffffffec4,
                                                         in_stack_fffffffffffffec0),
                                       in_stack_fffffffffffffeb8);
      in_stack_fffffffffffffef8 = local_b0;
      local_b0 = pIVar6;
    }
    iVar3 = termCanDriveIndex((WhereTerm *)
                              CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                              (SrcList_item *)
                              CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                              (Bitmask)in_stack_fffffffffffffeb8);
    if (iVar3 != 0) {
      iVar3 = (int)local_38[5];
      if (iVar3 < 0x40) {
        uVar11 = 1L << ((byte)iVar3 & 0x3f);
      }
      else {
        uVar11 = 0x8000000000000000;
      }
      in_stack_fffffffffffffee8 = uVar11;
      if (!bVar2) {
        sqlite3_log(0x11c,"automatic index on %s(%s)",pTVar1->zName,pTVar1->aCol[iVar3].zName);
        bVar2 = true;
      }
      if ((local_98 & uVar11) == 0) {
        iVar3 = whereLoopResize((sqlite3 *)
                                CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                                (WhereLoop *)
                                CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                                (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
        if (iVar3 != 0) goto LAB_001bcf90;
        *(long **)(plVar12[7] + (long)local_2c * 8) = local_38;
        local_98 = uVar11 | local_98;
        local_2c = local_2c + 1;
      }
    }
  }
  *(short *)((long)plVar12 + 0x2c) = (short)local_2c;
  *(short *)(plVar12 + 3) = (short)local_2c;
  *(undefined4 *)(plVar12 + 5) = 0x4241;
  uVar11 = *(ulong *)(in_RDX + 0x58);
  uVar9 = local_98 ^ 0xffffffffffffffff;
  if (pTVar1->nCol < 0x40) {
    iVar3 = (int)pTVar1->nCol;
  }
  else {
    iVar3 = 0x3f;
  }
  for (local_70 = 0; local_70 < iVar3; local_70 = local_70 + 1) {
  }
  iVar10 = iVar3;
  pIVar6 = sqlite3AllocateIndexObject
                     ((sqlite3 *)CONCAT44(iVar3,in_stack_fffffffffffffee0),
                      (i16)((ulong)in_stack_fffffffffffffed8 >> 0x30),(int)in_stack_fffffffffffffed8
                      ,(char **)in_stack_fffffffffffffed0);
  if (pIVar6 != (Index *)0x0) {
    plVar12[4] = (long)pIVar6;
    pIVar6->zName = "auto-index";
    pIVar6->pTable = pTVar1;
    local_6c = 0;
    local_98 = 0;
    for (local_38 = (long *)in_RSI[4]; iVar4 = (int)(in_stack_fffffffffffffee8 >> 0x20),
        local_38 < plVar5; local_38 = local_38 + 8) {
      iVar4 = termCanDriveIndex((WhereTerm *)
                                CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                                (SrcList_item *)
                                CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                                (Bitmask)in_stack_fffffffffffffeb8);
      if (iVar4 != 0) {
        if ((int)local_38[5] < 0x40) {
          in_stack_fffffffffffffed8 = (Parse *)(1L << ((byte)(int)local_38[5] & 0x3f));
        }
        else {
          in_stack_fffffffffffffed8 = (Parse *)0x8000000000000000;
        }
        in_stack_ffffffffffffff10 = in_stack_fffffffffffffed8;
        if ((local_98 & (ulong)in_stack_fffffffffffffed8) == 0) {
          in_stack_ffffffffffffff08 = (Expr *)*local_38;
          local_98 = (ulong)in_stack_fffffffffffffed8 | local_98;
          pIVar6->aiColumn[local_6c] = (i16)(int)local_38[5];
          pCVar7 = sqlite3BinaryCompareCollSeq
                             ((Parse *)in_stack_fffffffffffffed0,
                              (Expr *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                              (Expr *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0))
          ;
          if (pCVar7 == (CollSeq *)0x0) {
            in_stack_fffffffffffffed0 = "BINARY";
          }
          else {
            in_stack_fffffffffffffed0 = pCVar7->zName;
          }
          pIVar6->azColl[local_6c] = in_stack_fffffffffffffed0;
          local_6c = local_6c + 1;
        }
      }
    }
    for (local_70 = 0; local_70 < iVar3; local_70 = local_70 + 1) {
      if ((uVar11 & (uVar9 | 0x8000000000000000) & 1L << ((byte)local_70 & 0x3f)) != 0) {
        pIVar6->aiColumn[local_6c] = (i16)local_70;
        pIVar6->azColl[local_6c] = "BINARY";
        local_6c = local_6c + 1;
      }
    }
    if ((*(ulong *)(in_RDX + 0x58) & 0x8000000000000000) != 0) {
      for (local_70 = 0x3f; local_70 < pTVar1->nCol; local_70 = local_70 + 1) {
        pIVar6->aiColumn[local_6c] = (i16)local_70;
        pIVar6->azColl[local_6c] = "BINARY";
        local_6c = local_6c + 1;
      }
    }
    pIVar6->aiColumn[local_6c] = -1;
    pIVar6->azColl[local_6c] = "BINARY";
    iVar3 = in_RDI->nTab;
    in_RDI->nTab = iVar3 + 1;
    *(int *)(in_R8 + 8) = iVar3;
    sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                      (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),(int)in_stack_fffffffffffffeb8
                      ,0);
    sqlite3VdbeSetP4KeyInfo
              ((Parse *)in_stack_fffffffffffffed0,
               (Index *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    lVar8 = *(long *)(*in_RSI + 8) + 8 + (ulong)*(byte *)(in_R8 + 0x2c) * 0x70;
    iVar3 = (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
    if ((*(byte *)(lVar8 + 0x3d) >> 4 & 1) == 0) {
      sqlite3VdbeAddOp1((Vdbe *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),iVar3,
                        (int)in_stack_fffffffffffffeb8);
    }
    else {
      in_stack_ffffffffffffff04 = *(int *)(lVar8 + 0x34);
      sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),iVar3,
                        (int)in_stack_fffffffffffffeb8,0);
      sqlite3VdbeAddOp3((Vdbe *)in_stack_fffffffffffffed8,
                        (int)((ulong)in_stack_fffffffffffffed0 >> 0x20),
                        (int)in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,
                        in_stack_fffffffffffffec8);
      sqlite3VdbeAddOp1((Vdbe *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                        (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),
                        (int)in_stack_fffffffffffffeb8);
    }
    if (local_b0 != (Index *)0x0) {
      local_b4 = sqlite3VdbeMakeLabel
                           ((Vdbe *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
      sqlite3ExprIfFalse(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                         in_stack_ffffffffffffff04,in_stack_ffffffffffffff00);
      *(uint *)(plVar12 + 5) = *(uint *)(plVar12 + 5) | 0x20000;
    }
    iVar3 = sqlite3GetTempReg(in_RDI);
    in_stack_fffffffffffffeb8 = (Expr *)0x0;
    in_stack_fffffffffffffec0 = 0;
    sqlite3GenerateIndexKey
              ((Parse *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               in_stack_fffffffffffffef8,(int)((ulong)in_stack_fffffffffffffef0 >> 0x20),
               (int)in_stack_fffffffffffffef0,iVar4,
               (int *)CONCAT44(iVar10,in_stack_fffffffffffffee0),(Index *)in_stack_ffffffffffffff10,
               in_stack_ffffffffffffff18);
    sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                      (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),(int)in_stack_fffffffffffffeb8
                      ,0);
    sqlite3VdbeChangeP5(p,0x10);
    if (local_b0 != (Index *)0x0) {
      sqlite3VdbeResolveLabel(p,local_b4);
    }
    addr = (u32)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
    if ((*(byte *)(lVar8 + 0x3d) >> 4 & 1) == 0) {
      sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),addr,
                        (int)in_stack_fffffffffffffeb8,0);
    }
    else {
      sqlite3VdbeChangeP2((Vdbe *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),addr
                          ,(int)in_stack_fffffffffffffeb8);
      translateColumnToCopy
                ((Parse *)CONCAT44(iVar10,in_stack_fffffffffffffee0),
                 (int)((ulong)in_stack_fffffffffffffed8 >> 0x20),(int)in_stack_fffffffffffffed8,
                 (int)((ulong)in_stack_fffffffffffffed0 >> 0x20),(int)in_stack_fffffffffffffed0);
      sqlite3VdbeGoto((Vdbe *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                      (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
    }
    sqlite3VdbeChangeP5(p,3);
    sqlite3VdbeJumpHere((Vdbe *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                        (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
    sqlite3ReleaseTempReg(in_RDI,iVar3);
    sqlite3VdbeJumpHere((Vdbe *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                        (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
  }
LAB_001bcf90:
  sqlite3ExprDelete((sqlite3 *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                    in_stack_fffffffffffffeb8);
  return;
}

Assistant:

static void constructAutomaticIndex(
  Parse *pParse,              /* The parsing context */
  WhereClause *pWC,           /* The WHERE clause */
  struct SrcList_item *pSrc,  /* The FROM clause term to get the next index */
  Bitmask notReady,           /* Mask of cursors that are not available */
  WhereLevel *pLevel          /* Write new index here */
){
  int nKeyCol;                /* Number of columns in the constructed index */
  WhereTerm *pTerm;           /* A single term of the WHERE clause */
  WhereTerm *pWCEnd;          /* End of pWC->a[] */
  Index *pIdx;                /* Object describing the transient index */
  Vdbe *v;                    /* Prepared statement under construction */
  int addrInit;               /* Address of the initialization bypass jump */
  Table *pTable;              /* The table being indexed */
  int addrTop;                /* Top of the index fill loop */
  int regRecord;              /* Register holding an index record */
  int n;                      /* Column counter */
  int i;                      /* Loop counter */
  int mxBitCol;               /* Maximum column in pSrc->colUsed */
  CollSeq *pColl;             /* Collating sequence to on a column */
  WhereLoop *pLoop;           /* The Loop object */
  char *zNotUsed;             /* Extra space on the end of pIdx */
  Bitmask idxCols;            /* Bitmap of columns used for indexing */
  Bitmask extraCols;          /* Bitmap of additional columns */
  u8 sentWarning = 0;         /* True if a warnning has been issued */
  Expr *pPartial = 0;         /* Partial Index Expression */
  int iContinue = 0;          /* Jump here to skip excluded rows */
  struct SrcList_item *pTabItem;  /* FROM clause term being indexed */
  int addrCounter = 0;        /* Address where integer counter is initialized */
  int regBase;                /* Array of registers where record is assembled */

  /* Generate code to skip over the creation and initialization of the
  ** transient index on 2nd and subsequent iterations of the loop. */
  v = pParse->pVdbe;
  assert( v!=0 );
  addrInit = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);

  /* Count the number of columns that will be added to the index
  ** and used to match WHERE clause constraints */
  nKeyCol = 0;
  pTable = pSrc->pTab;
  pWCEnd = &pWC->a[pWC->nTerm];
  pLoop = pLevel->pWLoop;
  idxCols = 0;
  for(pTerm=pWC->a; pTerm<pWCEnd; pTerm++){
    Expr *pExpr = pTerm->pExpr;
    assert( !ExprHasProperty(pExpr, EP_FromJoin)    /* prereq always non-zero */
         || pExpr->iRightJoinTable!=pSrc->iCursor   /*   for the right-hand   */
         || pLoop->prereq!=0 );                     /*   table of a LEFT JOIN */
    if( pLoop->prereq==0
     && (pTerm->wtFlags & TERM_VIRTUAL)==0
     && !ExprHasProperty(pExpr, EP_FromJoin)
     && sqlite3ExprIsTableConstant(pExpr, pSrc->iCursor) ){
      pPartial = sqlite3ExprAnd(pParse->db, pPartial,
                                sqlite3ExprDup(pParse->db, pExpr, 0));
    }
    if( termCanDriveIndex(pTerm, pSrc, notReady) ){
      int iCol = pTerm->u.leftColumn;
      Bitmask cMask = iCol>=BMS ? MASKBIT(BMS-1) : MASKBIT(iCol);
      testcase( iCol==BMS );
      testcase( iCol==BMS-1 );
      if( !sentWarning ){
        sqlite3_log(SQLITE_WARNING_AUTOINDEX,
            "automatic index on %s(%s)", pTable->zName,
            pTable->aCol[iCol].zName);
        sentWarning = 1;
      }
      if( (idxCols & cMask)==0 ){
        if( whereLoopResize(pParse->db, pLoop, nKeyCol+1) ){
          goto end_auto_index_create;
        }
        pLoop->aLTerm[nKeyCol++] = pTerm;
        idxCols |= cMask;
      }
    }
  }
  assert( nKeyCol>0 );
  pLoop->u.btree.nEq = pLoop->nLTerm = nKeyCol;
  pLoop->wsFlags = WHERE_COLUMN_EQ | WHERE_IDX_ONLY | WHERE_INDEXED
                     | WHERE_AUTO_INDEX;

  /* Count the number of additional columns needed to create a
  ** covering index.  A "covering index" is an index that contains all
  ** columns that are needed by the query.  With a covering index, the
  ** original table never needs to be accessed.  Automatic indices must
  ** be a covering index because the index will not be updated if the
  ** original table changes and the index and table cannot both be used
  ** if they go out of sync.
  */
  extraCols = pSrc->colUsed & (~idxCols | MASKBIT(BMS-1));
  mxBitCol = MIN(BMS-1,pTable->nCol);
  testcase( pTable->nCol==BMS-1 );
  testcase( pTable->nCol==BMS-2 );
  for(i=0; i<mxBitCol; i++){
    if( extraCols & MASKBIT(i) ) nKeyCol++;
  }
  if( pSrc->colUsed & MASKBIT(BMS-1) ){
    nKeyCol += pTable->nCol - BMS + 1;
  }

  /* Construct the Index object to describe this index */
  pIdx = sqlite3AllocateIndexObject(pParse->db, nKeyCol+1, 0, &zNotUsed);
  if( pIdx==0 ) goto end_auto_index_create;
  pLoop->u.btree.pIndex = pIdx;
  pIdx->zName = "auto-index";
  pIdx->pTable = pTable;
  n = 0;
  idxCols = 0;
  for(pTerm=pWC->a; pTerm<pWCEnd; pTerm++){
    if( termCanDriveIndex(pTerm, pSrc, notReady) ){
      int iCol = pTerm->u.leftColumn;
      Bitmask cMask = iCol>=BMS ? MASKBIT(BMS-1) : MASKBIT(iCol);
      testcase( iCol==BMS-1 );
      testcase( iCol==BMS );
      if( (idxCols & cMask)==0 ){
        Expr *pX = pTerm->pExpr;
        idxCols |= cMask;
        pIdx->aiColumn[n] = pTerm->u.leftColumn;
        pColl = sqlite3BinaryCompareCollSeq(pParse, pX->pLeft, pX->pRight);
        pIdx->azColl[n] = pColl ? pColl->zName : sqlite3StrBINARY;
        n++;
      }
    }
  }
  assert( (u32)n==pLoop->u.btree.nEq );

  /* Add additional columns needed to make the automatic index into
  ** a covering index */
  for(i=0; i<mxBitCol; i++){
    if( extraCols & MASKBIT(i) ){
      pIdx->aiColumn[n] = i;
      pIdx->azColl[n] = sqlite3StrBINARY;
      n++;
    }
  }
  if( pSrc->colUsed & MASKBIT(BMS-1) ){
    for(i=BMS-1; i<pTable->nCol; i++){
      pIdx->aiColumn[n] = i;
      pIdx->azColl[n] = sqlite3StrBINARY;
      n++;
    }
  }
  assert( n==nKeyCol );
  pIdx->aiColumn[n] = XN_ROWID;
  pIdx->azColl[n] = sqlite3StrBINARY;

  /* Create the automatic index */
  assert( pLevel->iIdxCur>=0 );
  pLevel->iIdxCur = pParse->nTab++;
  sqlite3VdbeAddOp2(v, OP_OpenAutoindex, pLevel->iIdxCur, nKeyCol+1);
  sqlite3VdbeSetP4KeyInfo(pParse, pIdx);
  VdbeComment((v, "for %s", pTable->zName));

  /* Fill the automatic index with content */
  pTabItem = &pWC->pWInfo->pTabList->a[pLevel->iFrom];
  if( pTabItem->fg.viaCoroutine ){
    int regYield = pTabItem->regReturn;
    addrCounter = sqlite3VdbeAddOp2(v, OP_Integer, 0, 0);
    sqlite3VdbeAddOp3(v, OP_InitCoroutine, regYield, 0, pTabItem->addrFillSub);
    addrTop =  sqlite3VdbeAddOp1(v, OP_Yield, regYield);
    VdbeCoverage(v);
    VdbeComment((v, "next row of %s", pTabItem->pTab->zName));
  }else{
    addrTop = sqlite3VdbeAddOp1(v, OP_Rewind, pLevel->iTabCur); VdbeCoverage(v);
  }
  if( pPartial ){
    iContinue = sqlite3VdbeMakeLabel(v);
    sqlite3ExprIfFalse(pParse, pPartial, iContinue, SQLITE_JUMPIFNULL);
    pLoop->wsFlags |= WHERE_PARTIALIDX;
  }
  regRecord = sqlite3GetTempReg(pParse);
  regBase = sqlite3GenerateIndexKey(
      pParse, pIdx, pLevel->iTabCur, regRecord, 0, 0, 0, 0
  );
  sqlite3VdbeAddOp2(v, OP_IdxInsert, pLevel->iIdxCur, regRecord);
  sqlite3VdbeChangeP5(v, OPFLAG_USESEEKRESULT);
  if( pPartial ) sqlite3VdbeResolveLabel(v, iContinue);
  if( pTabItem->fg.viaCoroutine ){
    sqlite3VdbeChangeP2(v, addrCounter, regBase+n);
    testcase( pParse->db->mallocFailed );
    translateColumnToCopy(pParse, addrTop, pLevel->iTabCur,
                          pTabItem->regResult, 1);
    sqlite3VdbeGoto(v, addrTop);
  }else{
    sqlite3VdbeAddOp2(v, OP_Next, pLevel->iTabCur, addrTop+1); VdbeCoverage(v);
  }
  sqlite3VdbeChangeP5(v, SQLITE_STMTSTATUS_AUTOINDEX);
  sqlite3VdbeJumpHere(v, addrTop);
  sqlite3ReleaseTempReg(pParse, regRecord);
  
  /* Jump here when skipping the initialization */
  sqlite3VdbeJumpHere(v, addrInit);

end_auto_index_create:
  sqlite3ExprDelete(pParse->db, pPartial);
}